

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
::GroupByState(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
               *this,IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>
                     *in,function<bool_(const_int_&)> *transformer)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_IState<linq::IGrouping<bool,_int_&>_>)._vptr_IState =
       (_func_int **)&PTR_Init_0013f5c0;
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::AdapterState
            (&(this->source).source,&in->source);
  std::function<bool_(const_int_&)>::function(&this->transformer,transformer);
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->result)._M_t._M_impl.super__Rb_tree_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->current)._M_node = (_Base_ptr)0x0;
  return;
}

Assistant:

GroupByState(S&& in, const std::function<KEY(const VALUE&)>& transformer) 
				: source(in), transformer(transformer)
			{
			}